

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unzGetLocalExtrafield(unzFile file,voidp buf,uint len)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  
  uVar2 = 0xffffff9a;
  if (file != (unzFile)0x0) {
    uVar6 = 0xffffff9a;
    lVar1 = *(long *)((long)file + 0x140);
    uVar2 = 0xffffff9a;
    if (lVar1 != 0) {
      uVar5 = (ulong)*(uint *)(lVar1 + 0x90) - *(long *)(lVar1 + 0x98);
      uVar2 = (uint)uVar5;
      if (buf != (voidp)0x0) {
        uVar4 = uVar2;
        if (len <= uVar5) {
          uVar4 = len;
        }
        if (uVar4 == 0) {
          uVar2 = 0;
        }
        else {
          lVar3 = call_zseek64((zlib_filefunc64_32_def *)(lVar1 + 200),*(voidpf *)(lVar1 + 0x120),
                               *(long *)(lVar1 + 0x98) + *(long *)(lVar1 + 0x88),0);
          uVar2 = 0xffffffff;
          if (lVar3 == 0) {
            uVar5 = (**(code **)(lVar1 + 0xd0))
                              (*(undefined8 *)(lVar1 + 0x100),*(undefined8 *)(lVar1 + 0x120),buf,
                               (ulong)uVar4,in_R8,in_R9,uVar6);
            uVar2 = 0xffffffff;
            if (uVar5 == uVar4) {
              uVar2 = uVar4;
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

extern int ZEXPORT unzGetLocalExtrafield(unzFile file, voidp buf, unsigned len)
{
    unz64_s* s;
    file_in_zip64_read_info_s* pfile_in_zip_read_info;
    uInt read_now;
    ZPOS64_T size_to_read;

    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    pfile_in_zip_read_info = s->pfile_in_zip_read;

    if (pfile_in_zip_read_info == NULL)
        return UNZ_PARAMERROR;

    size_to_read = (pfile_in_zip_read_info->size_local_extrafield -
        pfile_in_zip_read_info->pos_local_extrafield);

    if (buf == NULL)
        return (int)size_to_read;

    if (len > size_to_read)
        read_now = (uInt)size_to_read;
    else
        read_now = (uInt)len;

    if (read_now == 0)
        return 0;

    if (ZSEEK64(pfile_in_zip_read_info->z_filefunc,
        pfile_in_zip_read_info->filestream,
        pfile_in_zip_read_info->offset_local_extrafield +
        pfile_in_zip_read_info->pos_local_extrafield,
        ZLIB_FILEFUNC_SEEK_SET) != 0)
        return UNZ_ERRNO;

    if (ZREAD64(pfile_in_zip_read_info->z_filefunc,
        pfile_in_zip_read_info->filestream,
        buf, read_now) != read_now)
        return UNZ_ERRNO;

    return (int)read_now;
}